

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dir.c
# Opt level: O3

int trim_finfo_highest(FINFO **fp,int highestp)

{
  finfo *pfVar1;
  int iVar2;
  size_t sVar3;
  finfo **ppfVar4;
  finfo *pfVar5;
  FINFO *pFVar6;
  FINFO *pFVar7;
  int iVar8;
  FINFO *pFVar9;
  finfo *pfVar10;
  FINFO *pFVar11;
  char ver [16];
  char local_48 [24];
  
  iVar2 = 0;
  iVar8 = 0;
  pFVar6 = *fp;
  pFVar11 = (FINFO *)0x0;
  do {
    pFVar7 = pFVar6;
    if (pFVar7->dirp == 0) {
      ppfVar4 = &pFVar7->next;
      pFVar6 = *ppfVar4;
      pFVar9 = pFVar7;
      pfVar10 = pFVar7;
      if (pFVar6 == (FINFO *)0x0) {
        pfVar5 = (finfo *)0x0;
      }
      else {
        iVar2 = strcmp(pFVar6->no_ver_name,pFVar7->no_ver_name);
        pfVar1 = pFVar6;
        while (pfVar5 = pfVar1, iVar2 == 0) {
          pfVar1 = pfVar5->next;
          pFVar9 = pFVar6;
          pfVar10 = pfVar5;
          if (pfVar1 == (finfo *)0x0) {
            pfVar5 = (finfo *)0x0;
            break;
          }
          iVar2 = strcmp(pfVar1->no_ver_name,pfVar5->no_ver_name);
        }
      }
      iVar2 = iVar8;
      if (pFVar7->version == 0) {
        if (pfVar10 == pFVar7) {
          sVar3 = strlen(pfVar10->lname);
          (pfVar10->lname + sVar3)[0] = ';';
          (pfVar10->lname + sVar3)[1] = '1';
          pfVar10->lname[sVar3 + 2] = '\0';
          pfVar10->lname_len = pfVar10->lname_len + 2;
          pFVar7 = pfVar10;
        }
        else {
          pfVar5 = pFVar7;
          do {
            pfVar5 = pfVar5->next;
            if (pfVar10 == pfVar5) break;
          } while (pfVar5->ino != pFVar7->ino);
          if (pfVar5->ino == pFVar7->ino) {
            if (pFVar9 != pfVar10) {
              *ppfVar4 = pFVar9->next;
              ppfVar4 = &pfVar10->next;
              pFVar9->next = pfVar10->next;
            }
            *ppfVar4 = (finfo *)0x0;
            pfVar10 = pFVar7;
            do {
              pFVar6 = pfVar10;
              pfVar10 = pFVar6->next;
            } while (pfVar10 != (finfo *)0x0);
            pFVar6->next = FreeFinfoList;
            ppfVar4 = &pFVar11->next;
            if (pFVar11 == (FINFO *)0x0) {
              ppfVar4 = fp;
            }
            FreeFinfoList = pFVar7;
            *ppfVar4 = pFVar9;
            pFVar7 = pFVar9;
          }
          else {
            sprintf(local_48,";%u",(ulong)(pFVar9->version + 1));
            strcat(pFVar7->lname,local_48);
            sVar3 = strlen(pFVar7->lname);
            pFVar7->lname_len = sVar3;
            pFVar7->next = pfVar10->next;
            pfVar10->next = (finfo *)0x0;
            pfVar10 = pFVar9;
            do {
              pFVar6 = pfVar10;
              pfVar10 = pFVar6->next;
            } while (pfVar10 != (finfo *)0x0);
            pFVar6->next = FreeFinfoList;
            FreeFinfoList = pFVar9;
          }
        }
      }
      else if (pfVar10 != pFVar7) {
        *ppfVar4 = pfVar5;
        pfVar10->next = (finfo *)0x0;
        pfVar10 = pFVar6;
        do {
          pFVar11 = pfVar10;
          pfVar10 = pFVar11->next;
        } while (pfVar10 != (finfo *)0x0);
        pFVar11->next = FreeFinfoList;
        FreeFinfoList = pFVar6;
      }
    }
    iVar2 = iVar2 + 1;
    iVar8 = iVar8 + 1;
    pFVar6 = pFVar7->next;
    pFVar11 = pFVar7;
    if (pFVar7->next == (finfo *)0x0) {
      return iVar2;
    }
  } while( true );
}

Assistant:

static int trim_finfo_highest(FINFO **fp, int highestp)
{
  FINFO *tp, *sp, *mp, *cp, *pp;
  int num, pnum;
  int linkp;
  char ver[VERSIONLEN];

  sp = mp = cp = *fp;
  pp = (FINFO *)NULL;
  num = pnum = 0;

  do {
    if (cp->dirp) {
      pp = cp;
      sp = cp = cp->next;
      pnum++;
      num++;
      continue;
    }

    if (cp->next != (FINFO *)NULL && strcmp(cp->next->no_ver_name, cp->no_ver_name) == 0) {
      mp = cp = cp->next;
      num++;
      while (cp->next != (FINFO *)NULL && strcmp(cp->next->no_ver_name, cp->no_ver_name) == 0) {
        cp = cp->next;
        num++;
      }
    } else {
      mp = cp;
    }

    if (sp->version == 0) {
      if (cp != sp) {
        /*
         * Both versionless and versioned files exists.
         */
        linkp = 0;
        tp = sp;
        do {
          tp = tp->next;
          if (tp->ino == sp->ino) {
            linkp = 1;
            break;
          }
        } while (cp != tp);

        if (!linkp) {
          /*
           * Versionless is not linked to any versioned
           * file.
           */
          sprintf(ver, ";%u", mp->version + 1);
          strcat(sp->lname, ver);
          sp->lname_len = strlen(sp->lname);
          /*
           * Lower versioned files, mp to cp
           * inclusive, should be removed.
           */
          sp->next = cp->next;
          cp->next = (FINFO *)NULL;
          FreeFinfo(mp);
          num = ++pnum;
          pp = sp;
          sp = cp = pp->next;
        } else {
          /*
           * Versionless is linked to one of versionless
           * files. We can remove it.
           */

          if (mp != cp) {
            sp->next = mp->next;
            mp->next = cp->next;
            cp->next = (FINFO *)NULL;
          } else {
            sp->next = (FINFO *)NULL;
          }
          FreeFinfo(sp);
          num = ++pnum;
          if (pp != (FINFO *)NULL)
            pp->next = mp;
          else
            *fp = mp;
          pp = mp;
          sp = cp = mp->next;
        }
      } else {
        /*
         * Only versionless file exists. It is regarded as
         * version 1.
         */
        strcat(cp->lname, ";1");
        cp->lname_len += 2;
        pp = cp;
        sp = cp = cp->next;
        num = ++pnum;
      }
    } else {
      if (cp != sp) {
        /*
         * All files are versioned.
         * Lower versioned files can be removed.
         */
        tp = sp->next;
        sp->next = cp->next;
        cp->next = (FINFO *)NULL;
        FreeFinfo(tp);
        num = ++pnum;
      } else {
        /*
         * A versioned file only exists.
         */
        num = ++pnum;
      }
      pp = sp;
      sp = cp = sp->next;
    }
  } while (sp != (FINFO *)NULL);

  return (num);
}